

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O3

Span * __thiscall SpanList::newSpan(SpanList *this,SpanMap *spanMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  key_type pbVar5;
  mapped_type pSVar6;
  char *__s;
  mapped_type *ppSVar7;
  key_type local_38;
  
  pbVar5 = (key_type)mmap((void *)0x0,(long)spanInfo[this->spanClass][2],3,0x21,0,0);
  pSVar6 = (mapped_type)operator_new(0x40);
  iVar1 = this->spanClass;
  iVar2 = spanInfo[iVar1][1];
  iVar3 = spanInfo[iVar1][2];
  iVar4 = spanInfo[iVar1][3];
  pSVar6->allocCount = 0;
  pSVar6->nelems = iVar4;
  pSVar6->startAddr = pbVar5;
  pSVar6->size = iVar3;
  (pSVar6->bitmap).bitmap = (char *)0x0;
  __s = (char *)operator_new__((long)iVar4);
  (pSVar6->bitmap).bitmap = __s;
  memset(__s,0,(long)iVar4);
  (pSVar6->bitmap).size = iVar4;
  pSVar6->spanClass = iVar1;
  pSVar6->elemsize = iVar2;
  local_38 = pbVar5;
  ppSVar7 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[](spanMap,&local_38);
  *ppSVar7 = pSVar6;
  pSVar6->prev = pSVar6;
  pSVar6->next = pSVar6;
  return pSVar6;
}

Assistant:

Span *SpanList::newSpan(SpanMap *spanMap) {
  // 没有 span了, 则调用mmap分配一个
  auto addr =
      mmap(NULL,                   //分配的首地址
           spanInfo[spanClass][2], //分配内存大小(必须是页的整数倍, 32位1页=4k)
           PROT_READ | PROT_WRITE, //映射区域保护权限：读|写
           MAP_ANON | MAP_SHARED, //匿名映射(不涉及文件io), 后面两个参数忽略
           0,                     //要映射到内存中的文件描述符
           0 //文件映射的偏移量，通常设置为0，必须是页的整数倍
      );
  // ! 产生 span的地方, 需要添加到 spanMap结构中
  Span *span = new Span(addr, spanInfo[spanClass][2], spanInfo[spanClass][3], 0,
                        spanClass, spanInfo[spanClass][1]);
  (*spanMap)[(bool *)addr] = span;
  span->prev = span;
  span->next = span;
  return span;
}